

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O2

bool doVisit<(arangodb::velocypack::Collection::VisitationOrder)2>
               (Slice slice,
               function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *func)

{
  ValueType VVar1;
  bool bVar2;
  Slice SVar3;
  Exception *this;
  bool bVar4;
  ObjectPair OVar5;
  ObjectIterator it;
  
  if (arangodb::velocypack::SliceStaticData::TypeMap[*slice._start] == Array) {
    arangodb::velocypack::ArrayIterator::ArrayIterator((ArrayIterator *)&it,slice);
    while (bVar4 = it._position == it._size, !bVar4) {
      SVar3 = arangodb::velocypack::ArrayIterator::value((ArrayIterator *)&it);
      VVar1 = arangodb::velocypack::SliceStaticData::TypeMap[*SVar3._start];
      bVar2 = std::function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)>::
              operator()(func,(Slice)0x114f30,SVar3);
      if (!bVar2) {
        return bVar4;
      }
      if (((VVar1 & ~Illegal) == Array) &&
         (bVar2 = doVisit<(arangodb::velocypack::Collection::VisitationOrder)2>(SVar3,func), !bVar2)
         ) {
        return bVar4;
      }
      arangodb::velocypack::ArrayIterator::next((ArrayIterator *)&it);
    }
  }
  else {
    if (arangodb::velocypack::SliceStaticData::TypeMap[*slice._start] != Object) {
      this = (Exception *)__cxa_allocate_exception(0x18);
      arangodb::velocypack::Exception::Exception
                (this,InvalidValueType,"Expecting type Object or Array");
      __cxa_throw(this,&arangodb::velocypack::Exception::typeinfo,
                  arangodb::velocypack::Exception::~Exception);
    }
    arangodb::velocypack::ObjectIterator::ObjectIterator(&it,slice,false);
    while (bVar4 = it._position == it._size, !bVar4) {
      OVar5 = arangodb::velocypack::ObjectIterator::operator*(&it);
      SVar3 = OVar5.value._start;
      VVar1 = arangodb::velocypack::SliceStaticData::TypeMap[*SVar3._start];
      bVar2 = std::function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)>::
              operator()(func,OVar5.key._start,SVar3);
      if (!bVar2) {
        return bVar4;
      }
      if (((VVar1 & ~Illegal) == Array) &&
         (bVar2 = doVisit<(arangodb::velocypack::Collection::VisitationOrder)2>(SVar3,func), !bVar2)
         ) {
        return bVar4;
      }
      arangodb::velocypack::ObjectIterator::next(&it);
    }
  }
  return bVar4;
}

Assistant:

static bool doVisit(
    Slice slice,
    std::function<bool(Slice key, Slice value)> const& func) {
  if (slice.isObject()) {
    return visitObject<order>(slice, func);
  }
  if (slice.isArray()) {
    return visitArray<order>(slice, func);
  }

  throw Exception(Exception::InvalidValueType,
                  "Expecting type Object or Array");
}